

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitV8X16Shuffle(WasmBytecodeGenerator *this)

{
  WasmRegisterSpace *this_00;
  WasmReaderBase *pWVar1;
  anon_union_24_9_42d746e4_for_WasmNode_1 *paVar2;
  WasmCompilationException *this_01;
  uint local_3c;
  uint i;
  uint8 *indices;
  EmitInfo EStack_28;
  RegSlot resultReg;
  EmitInfo arg1Info;
  EmitInfo arg2Info;
  WasmBytecodeGenerator *this_local;
  EmitInfo resultInfo;
  
  arg1Info = PopEvalStack(this,V128,(char16 *)0x0);
  EStack_28 = PopEvalStack(this,V128,(char16 *)0x0);
  ReleaseLocation(this,&arg1Info);
  ReleaseLocation(this,&stack0xffffffffffffffd8);
  this_00 = GetRegisterSpace(this,V128);
  indices._4_4_ = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  indices._0_4_ = 5;
  EmitInfo::EmitInfo((EmitInfo *)&this_local,indices._4_4_,(WasmType *)&indices);
  pWVar1 = GetReader(this);
  paVar2 = &(pWVar1->m_currentNode).field_1;
  local_3c = 0;
  while( true ) {
    if (0xf < local_3c) {
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x15])
                (this->m_writer,0x230,(ulong)indices._4_4_,(ulong)EStack_28 & 0xffffffff,
                 (ulong)arg1Info & 0xffffffff,paVar2);
      return (EmitInfo)this_local;
    }
    if (0x1f < *(byte *)((long)paVar2 + (ulong)local_3c)) break;
    local_3c = local_3c + 1;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"%u-th shuffle lane index is larger than %u",(ulong)local_3c,0x1f);
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitV8X16Shuffle()
{
    EmitInfo arg2Info = PopEvalStack(WasmTypes::V128);
    EmitInfo arg1Info = PopEvalStack(WasmTypes::V128);

    ReleaseLocation(&arg2Info);
    ReleaseLocation(&arg1Info);

    Js::RegSlot resultReg = GetRegisterSpace(WasmTypes::V128)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, WasmTypes::V128);

    uint8* indices = GetReader()->m_currentNode.shuffle.indices;
    for (uint i = 0; i < Simd::MAX_LANES; i++)
    {
        if (indices[i] >= Simd::MAX_LANES * 2)
        {
            throw WasmCompilationException(_u("%u-th shuffle lane index is larger than %u"), i, (Simd::MAX_LANES * 2 -1));
        }
    }

    m_writer->AsmShuffle(Js::OpCodeAsmJs::Simd128_Shuffle_V8X16, resultReg, arg1Info.location, arg2Info.location, indices);
    return resultInfo;
}